

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O1

lws * lws_adopt_descriptor_vhost_via_info(lws_adopt_desc_t *info)

{
  lws *plVar1;
  
  plVar1 = lws_adopt_descriptor_vhost1
                     (info->vh,info->type,info->vh_prot_name,info->parent,info->opaque);
  if (plVar1 != (lws *)0x0) {
    plVar1 = lws_adopt_descriptor_vhost2(plVar1,info->type,info->fd);
    return plVar1;
  }
  if ((info->type & LWS_ADOPT_SOCKET) != LWS_ADOPT_RAW_FILE_DESC) {
    close((info->fd).sockfd);
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_adopt_descriptor_vhost_via_info(const lws_adopt_desc_t *info)
{
	struct lws *new_wsi;
#if defined(LWS_WITH_PEER_LIMITS)
	struct lws_peer *peer = NULL;

	if (info->type & LWS_ADOPT_SOCKET) {
		peer = lws_get_or_create_peer(info->vh, info->fd.sockfd);

		if (peer && info->vh->context->ip_limit_wsi &&
		    peer->count_wsi >= info->vh->context->ip_limit_wsi) {
			lwsl_notice("Peer reached wsi limit %d\n",
					info->vh->context->ip_limit_wsi);
			lws_stats_bump(&info->vh->context->pt[0],
					      LWSSTATS_C_PEER_LIMIT_WSI_DENIED,
					      1);
			return NULL;
		}
	}
#endif

	new_wsi = lws_adopt_descriptor_vhost1(info->vh, info->type,
					      info->vh_prot_name, info->parent,
					      info->opaque);
	if (!new_wsi) {
		if (info->type & LWS_ADOPT_SOCKET)
			compatible_close(info->fd.sockfd);
		return NULL;
	}

#if defined(LWS_WITH_ACCESS_LOG)
		lws_get_peer_simple_fd(info->fd.sockfd, new_wsi->simple_ip,
					sizeof(new_wsi->simple_ip));
#endif

#if defined(LWS_WITH_PEER_LIMITS)
	if (peer)
		lws_peer_add_wsi(info->vh->context, peer, new_wsi);
#endif

	return lws_adopt_descriptor_vhost2(new_wsi, info->type, info->fd);
}